

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseCommand(JSONParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  Command *pCVar2;
  bool bVar3;
  Result RVar4;
  char *format;
  Command *local_20;
  
  pCVar2 = local_20;
  RVar4 = Expect(this,"{");
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  RVar4 = ExpectKey(this,"type");
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  bVar3 = Match(this,"\"module\"");
  if (bVar3) {
    std::make_unique<spectest::ModuleCommand>();
    RVar4 = Expect(this,",");
    if (((RVar4.enum_ == Error) || (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ == Error))
       || ((RVar4 = Expect(this,","), RVar4.enum_ == Error ||
           (RVar4 = ParseOptNameStringValue(this,(string *)&local_20[3].type), RVar4.enum_ == Error)
           ))) goto LAB_0011a41e;
    RVar4 = ParseFilename(this,(string *)&local_20[1].type);
LAB_0011a096:
    if (RVar4.enum_ == Error) goto LAB_0011a41e;
    local_20 = (Command *)0x0;
    pCVar1 = (out_command->_M_t).
             super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>._M_t.
             super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>.
             super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl;
    (out_command->_M_t).
    super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>._M_t.
    super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>.
    super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl = pCVar2;
    if (pCVar1 == (Command *)0x0) goto LAB_0011a436;
    (*pCVar1->_vptr_Command[1])();
    bVar3 = true;
  }
  else {
    bVar3 = Match(this,"\"action\"");
    if (bVar3) {
      std::make_unique<spectest::ActionCommandBase<(wabt::CommandType)2>>();
LAB_00119f70:
      RVar4 = Expect(this,",");
      if (((RVar4.enum_ != Error) && (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ != Error)
          ) && (RVar4 = Expect(this,","), RVar4.enum_ != Error)) {
        RVar4 = ParseAction(this,(Action *)(local_20 + 1));
LAB_00119fcb:
        if ((RVar4.enum_ != Error) && (RVar4 = Expect(this,","), RVar4.enum_ != Error)) {
          RVar4 = ParseActionResult(this);
          goto LAB_0011a096;
        }
      }
    }
    else {
      bVar3 = Match(this,"\"register\"");
      if (bVar3) {
        std::make_unique<spectest::RegisterCommand>();
        RVar4 = Expect(this,",");
        if (((RVar4.enum_ != Error) &&
            (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ != Error)) &&
           ((RVar4 = Expect(this,","), RVar4.enum_ != Error &&
            (RVar4 = ParseOptNameStringValue(this,(string *)(local_20 + 3)), RVar4.enum_ != Error)))
           ) {
          RVar4 = ParseKeyStringValue(this,"as",(string *)(local_20 + 1));
          goto LAB_0011a096;
        }
      }
      else {
        bVar3 = Match(this,"\"assert_malformed\"");
        if (bVar3) {
          std::make_unique<spectest::AssertModuleCommand<(wabt::CommandType)4>>();
        }
        else {
          bVar3 = Match(this,"\"assert_invalid\"");
          if (bVar3) {
            std::make_unique<spectest::AssertModuleCommand<(wabt::CommandType)5>>();
          }
          else {
            bVar3 = Match(this,"\"assert_unlinkable\"");
            if (bVar3) {
              std::make_unique<spectest::AssertModuleCommand<(wabt::CommandType)6>>();
            }
            else {
              bVar3 = Match(this,"\"assert_uninstantiable\"");
              if (!bVar3) {
                bVar3 = Match(this,"\"assert_return\"");
                if (bVar3) {
                  std::make_unique<spectest::AssertReturnCommand>();
                  RVar4 = Expect(this,",");
                  if (((RVar4.enum_ != Error) &&
                      (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ != Error)) &&
                     ((RVar4 = Expect(this,","), RVar4.enum_ != Error &&
                      ((RVar4 = ParseAction(this,(Action *)(local_20 + 1)), RVar4.enum_ != Error &&
                       (RVar4 = Expect(this,","), RVar4.enum_ != Error)))))) {
                    bVar3 = Match(this,"\"either\"");
                    if (bVar3) {
                      RVar4 = Expect(this,":");
                      if (RVar4.enum_ != Error) {
                        *(undefined1 *)&local_20[10]._vptr_Command = 1;
LAB_0011a45e:
                        RVar4 = ParseExpectedValues(this,(
                                                  vector<spectest::ExpectedValue,_std::allocator<spectest::ExpectedValue>_>
                                                  *)&local_20[8].type);
                        goto LAB_0011a096;
                      }
                    }
                    else {
                      RVar4 = ExpectKey(this,"expected");
                      if (RVar4.enum_ != Error) goto LAB_0011a45e;
                    }
                  }
                }
                else {
                  bVar3 = Match(this,"\"assert_trap\"");
                  if (bVar3) {
                    std::make_unique<spectest::AssertTrapCommandBase<(wabt::CommandType)9>>();
                  }
                  else {
                    bVar3 = Match(this,"\"assert_exhaustion\"");
                    if (!bVar3) {
                      bVar3 = Match(this,"\"assert_exception\"");
                      if (!bVar3) {
                        format = "unknown command type";
LAB_0011a3fe:
                        PrintError(this,format);
                        return (Result)Error;
                      }
                      if (s_features.exceptions_enabled_ == false) {
                        format = "invalid command: exceptions not allowed";
                        goto LAB_0011a3fe;
                      }
                      std::make_unique<spectest::AssertExceptionCommand>();
                      goto LAB_00119f70;
                    }
                    std::make_unique<spectest::AssertTrapCommandBase<(wabt::CommandType)10>>();
                  }
                  RVar4 = Expect(this,",");
                  if ((((RVar4.enum_ != Error) &&
                       (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ != Error)) &&
                      (RVar4 = Expect(this,","), RVar4.enum_ != Error)) &&
                     ((RVar4 = ParseAction(this,(Action *)(local_20 + 1)), RVar4.enum_ != Error &&
                      (RVar4 = Expect(this,","), RVar4.enum_ != Error)))) {
                    RVar4 = ParseKeyStringValue(this,"text",(string *)&local_20[8].type);
                    goto LAB_00119fcb;
                  }
                }
                goto LAB_0011a41e;
              }
              std::make_unique<spectest::AssertModuleCommand<(wabt::CommandType)7>>();
            }
          }
        }
        RVar4 = Expect(this,",");
        if ((((RVar4.enum_ != Error) &&
             (RVar4 = ParseLine(this,&local_20->line), RVar4.enum_ != Error)) &&
            (RVar4 = Expect(this,","), RVar4.enum_ != Error)) &&
           (((RVar4 = ParseFilename(this,(string *)&local_20[1].type), RVar4.enum_ != Error &&
             (RVar4 = Expect(this,","), RVar4.enum_ != Error)) &&
            ((RVar4 = ParseKeyStringValue(this,"text",(string *)&local_20[3].type),
             RVar4.enum_ != Error && (RVar4 = Expect(this,","), RVar4.enum_ != Error)))))) {
          RVar4 = ParseModuleType(this,(ModuleType *)(local_20 + 1));
          goto LAB_0011a096;
        }
      }
    }
LAB_0011a41e:
    bVar3 = false;
  }
  if (local_20 != (Command *)0x0) {
    (*local_20->_vptr_Command[1])();
  }
  if (!bVar3) {
    return (Result)Error;
  }
LAB_0011a436:
  RVar4 = Expect(this,"}");
  return (Result)(uint)(RVar4.enum_ == Error);
}

Assistant:

wabt::Result JSONParser::ParseCommand(CommandPtr* out_command) {
  EXPECT("{");
  EXPECT_KEY("type");
  if (Match("\"module\"")) {
    auto command = std::make_unique<ModuleCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseOptNameStringValue(&command->name));
    CHECK_RESULT(ParseFilename(&command->filename));
    *out_command = std::move(command);
  } else if (Match("\"action\"")) {
    auto command = std::make_unique<ActionCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else if (Match("\"register\"")) {
    auto command = std::make_unique<RegisterCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseOptNameStringValue(&command->name));
    PARSE_KEY_STRING_VALUE("as", &command->as);
    *out_command = std::move(command);
  } else if (Match("\"assert_malformed\"")) {
    auto command = std::make_unique<AssertMalformedCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_invalid\"")) {
    auto command = std::make_unique<AssertInvalidCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_unlinkable\"")) {
    auto command = std::make_unique<AssertUnlinkableCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_uninstantiable\"")) {
    auto command = std::make_unique<AssertUninstantiableCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseFilename(&command->filename));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseModuleType(&command->type));
    *out_command = std::move(command);
  } else if (Match("\"assert_return\"")) {
    auto command = std::make_unique<AssertReturnCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    if (Match("\"either\"")) {
      EXPECT(":");
      command->expect_either = true;
    } else {
      EXPECT_KEY("expected");
    }
    CHECK_RESULT(ParseExpectedValues(&command->expected));
    *out_command = std::move(command);
  } else if (Match("\"assert_trap\"")) {
    auto command = std::make_unique<AssertTrapCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else if (Match("\"assert_exhaustion\"")) {
    auto command = std::make_unique<AssertExhaustionCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    PARSE_KEY_STRING_VALUE("text", &command->text);
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else if (Match("\"assert_exception\"")) {
    if (!s_features.exceptions_enabled()) {
      PrintError("invalid command: exceptions not allowed");
      return wabt::Result::Error;
    }
    auto command = std::make_unique<AssertExceptionCommand>();
    EXPECT(",");
    CHECK_RESULT(ParseLine(&command->line));
    EXPECT(",");
    CHECK_RESULT(ParseAction(&command->action));
    EXPECT(",");
    CHECK_RESULT(ParseActionResult());
    *out_command = std::move(command);
  } else {
    PrintError("unknown command type");
    return wabt::Result::Error;
  }
  EXPECT("}");
  return wabt::Result::Ok;
}